

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssp_blas3.c
# Opt level: O0

int sp_sgemm(char *transa,char *transb,int m,int n,int k,float alpha,SuperMatrix *A,float *b,int ldb
            ,float beta,float *c,int ldc)

{
  int local_40;
  int j;
  int incy;
  int incx;
  float beta_local;
  SuperMatrix *A_local;
  float alpha_local;
  int k_local;
  int n_local;
  int m_local;
  char *transb_local;
  char *transa_local;
  
  for (local_40 = 0; local_40 < n; local_40 = local_40 + 1) {
    sp_sgemv(transa,alpha,A,b + ldb * local_40,1,beta,c + ldc * local_40,1);
  }
  return 0;
}

Assistant:

int
sp_sgemm(char *transa, char *transb, int m, int n, int k, 
         float alpha, SuperMatrix *A, float *b, int ldb, 
         float beta, float *c, int ldc)
{
    int    incx = 1, incy = 1;
    int    j;

    for (j = 0; j < n; ++j) {
	sp_sgemv(transa, alpha, A, &b[ldb*j], incx, beta, &c[ldc*j], incy);
    }
    return 0;    
}